

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

AtomSpan __thiscall Potassco::SmodelsConvert::SmData::mapHead(SmData *this,AtomSpan *h)

{
  Atom AVar1;
  Atom *pAVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  iterator iVar6;
  Atom_t *pAVar7;
  AtomSpan AVar8;
  uint local_30;
  uint local_2c;
  
  puVar4 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6._M_current =
       (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current != puVar4) {
    (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
    iVar6._M_current = puVar4;
  }
  if (h->size != 0) {
    pAVar7 = h->first;
    do {
      pAVar2 = mapAtom(this,*pAVar7);
      AVar1 = *pAVar2;
      *pAVar2 = (Atom)((uint)AVar1 | 0x10000000);
      local_2c = (uint)AVar1 & 0xfffffff;
      iVar6._M_current =
           (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->head_,iVar6,&local_2c);
      }
      else {
        *iVar6._M_current = local_2c;
        (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pAVar7 = pAVar7 + 1;
    } while (pAVar7 != h->first + h->size);
    puVar4 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6._M_current =
         (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  if (puVar4 == iVar6._M_current) {
    local_30 = 1;
    if (iVar6._M_current ==
        (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->head_,iVar6,&local_30);
      puVar4 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar6._M_current =
           (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar6._M_current = 1;
      iVar6._M_current = iVar6._M_current + 1;
      (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current;
    }
  }
  puVar3 = puVar4;
  if ((long)iVar6._M_current - (long)puVar4 == 0) {
    puVar3 = (uint *)0x0;
  }
  puVar5 = (uint *)((long)iVar6._M_current - (long)puVar4 >> 2);
  if (iVar6._M_current == puVar4) {
    puVar5 = (uint *)0x0;
  }
  AVar8.size = (size_t)puVar5;
  AVar8.first = puVar3;
  return AVar8;
}

Assistant:

AtomSpan SmodelsConvert::SmData::mapHead(const AtomSpan& h) {
	head_.clear();
	for (const Atom_t* x = begin(h); x != end(h); ++x) {
		head_.push_back(mapHeadAtom(*x));
	}
	if (head_.empty()) { head_.push_back(falseAtom()); }
	return toSpan(head_);
}